

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

UVec3 __thiscall vkt::sparse::computeWorkGroupSize(sparse *this,UVec3 *gridSize)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  UVec3 UVar5;
  
  uVar2 = 0x80;
  if (gridSize->m_data[0] < 0x80) {
    uVar2 = gridSize->m_data[0];
  }
  uVar4 = (uint)(byte)(0x80 / (byte)uVar2);
  if (gridSize->m_data[1] < uVar4) {
    uVar4 = gridSize->m_data[1];
  }
  uVar1 = 0x80 / (uVar4 * uVar2 & 0xffff);
  if (gridSize->m_data[2] < uVar1) {
    uVar1 = gridSize->m_data[2];
  }
  uVar3 = 0x40;
  if (uVar1 < 0x40) {
    uVar3 = uVar1;
  }
  *(uint *)this = uVar2;
  *(uint *)(this + 4) = uVar4;
  *(uint *)(this + 8) = uVar3;
  UVar5.m_data[2] = uVar3;
  UVar5.m_data._0_8_ = this;
  return (UVec3)UVar5.m_data;
}

Assistant:

T						z			(void) const { DE_STATIC_ASSERT(Size >= 3); return m_data[2]; }